

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffuse.cpp
# Opt level: O0

Spectrum * __thiscall
phyr::DiffuseAreaLight::sample_li
          (DiffuseAreaLight *this,Interaction *ref,Point2f *u,Vector3f *wi,double *pdf,
          VisibilityTester *vis)

{
  element_type *peVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  Interaction *in_RSI;
  Interaction *in_RDI;
  undefined8 *in_R8;
  double *in_R9;
  double dVar2;
  void *in_stack_00000008;
  Interaction pShape;
  Interaction *p1;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 uVar3;
  undefined1 local_1a8 [24];
  undefined1 local_190 [216];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  Vector3<double> local_a0;
  undefined1 local_88 [96];
  double *local_28;
  undefined8 *local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  p1 = in_RDI;
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_RDX;
  peVar1 = std::__shared_ptr_access<phyr::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<phyr::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x191bb9);
  (*peVar1->_vptr_Shape[9])(local_88,peVar1,local_10,local_18,local_28);
  uVar3 = true;
  if ((*local_28 != 0.0) || (NAN(*local_28))) {
    Point3<double>::operator-(&p1->p,&in_RDI->p);
    dVar2 = Vector3<double>::lengthSquared(&local_a0);
    uVar3 = dVar2 == 0.0;
  }
  if ((bool)uVar3 == false) {
    Point3<double>::operator-(&p1->p,&in_RDI->p);
    normalize<double>((Vector3<double> *)CONCAT17(uVar3,in_stack_fffffffffffffe50));
    *local_20 = local_b8;
    local_20[1] = local_b0;
    local_20[2] = local_a8;
    VisibilityTester::VisibilityTester
              ((VisibilityTester *)CONCAT17(uVar3,in_stack_fffffffffffffe50),in_RSI,p1);
    memcpy(in_stack_00000008,local_190,0xc0);
    Vector3<double>::operator-((Vector3<double> *)p1);
    (**(code **)((long)(in_RSI->p).x + 0x48))(in_RDI,in_RSI,local_88,local_1a8);
  }
  else {
    *local_28 = 0.0;
    SampledSpectrum::SampledSpectrum((SampledSpectrum *)p1,(double)in_RDI);
  }
  return (Spectrum *)p1;
}

Assistant:

Spectrum DiffuseAreaLight::sample_li(const Interaction& ref, const Point2f& u,
                                     Vector3f* wi, Real* pdf,
                                     VisibilityTester* vis) const {
    Interaction pShape = shape->sample(ref, u, pdf);
    if (*pdf == 0 || (pShape.p - ref.p).lengthSquared() == 0) {
        *pdf = 0;
        return 0.f;
    }
    *wi = normalize(pShape.p - ref.p);
    *vis = VisibilityTester(ref, pShape);
    return l(pShape, -*wi);
}